

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::removeButton(QMessageBox *this,QAbstractButton *button)

{
  QMessageBoxPrivate *this_00;
  long in_FS_OFFSET;
  QPushButton *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_20 = (QPushButton *)button;
  QtPrivate::sequential_erase_with_copy<QList<QAbstractButton*>,QAbstractButton*>
            (&this_00->customButtonList,(QAbstractButton **)&local_20);
  if ((QPushButton *)this_00->escapeButton == local_20) {
    this_00->escapeButton = (QAbstractButton *)0x0;
  }
  if (this_00->defaultButton == local_20) {
    this_00->defaultButton = (QPushButton *)0x0;
  }
  QDialogButtonBox::removeButton
            ((QDialogButtonBox *)this_00->buttonBox,&local_20->super_QAbstractButton);
  QMessageBoxPrivate::updateSize(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::removeButton(QAbstractButton *button)
{
    Q_D(QMessageBox);
    d->customButtonList.removeAll(button);
    if (d->escapeButton == button)
        d->escapeButton = nullptr;
    if (d->defaultButton == button)
        d->defaultButton = nullptr;
    d->buttonBox->removeButton(button);
    d->updateSize();
}